

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_unit_test.cpp
# Opt level: O2

void __thiscall
insert_duplicated_vertices<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::test_method
          (insert_duplicated_vertices<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
           *this)

{
  undefined8 uVar1;
  undefined1 uVar2;
  int iVar3;
  ostream *poVar4;
  size_t sVar5;
  char *local_5a8;
  char *pcStack_5a0;
  char **local_598;
  undefined8 local_590;
  shared_count sStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  Simplex_tree<Gudhi::Simplex_tree_options_default> st;
  Simplex_handle local_4d0;
  Simplex_handle local_4c8;
  Simplex_handle local_4c0;
  Simplex_handle local_4b8;
  Simplex_handle local_4b0;
  Simplex_handle local_4a8;
  Simplex_handle local_4a0;
  Simplex_handle local_498;
  Simplex_handle local_490;
  Simplex_handle local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  poVar4 = std::operator<<((ostream *)&std::clog,
                           "********************************************************************");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::clog,"TEST INSERT DUPLICATED VERTICES");
  std::endl<char,std::char_traits<char>>(poVar4);
  st.nodes_label_to_list_._M_h._M_buckets = &st.nodes_label_to_list_._M_h._M_single_bucket;
  st.nodes_label_to_list_._M_h._M_bucket_count = 1;
  st.nodes_label_to_list_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  st.nodes_label_to_list_._M_h._M_element_count = 0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  st.nodes_label_to_list_._M_h._M_rehash_policy._M_next_resize = 0;
  st.nodes_label_to_list_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  st.null_vertex_ = -1;
  st.root_.oncles_ =
       (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
        *)0x0;
  st.root_.parent_ = -1;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.filtration_vect_.
  super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  st.dimension_ = -1;
  st.dimension_to_be_lowered_ = false;
  local_598 = (char **)(local_580 + 0x20);
  local_560._0_4_ = 1.4013e-45;
  local_590 = 1;
  local_5a8 = (char *)0x0;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_580,
             (initializer_list<int> *)&st,(Filtration_value *)&local_598);
  uVar1 = local_580._0_8_;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3c8);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "success";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_58 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x3c9);
  local_598._0_1_ =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1 !=
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "sh != st.null_simplex()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_88 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  local_488.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_488);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x3cb);
  local_490.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_490);
  local_598 = (char **)CONCAT71(local_598._1_7_,iVar3 == 0);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension(sh) == 0";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_b8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_5a8 = (char *)0x200000002;
  local_590 = 2;
  local_560 = (undefined1  [8])0x0;
  local_598 = &local_5a8;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_580,
             (initializer_list<int> *)&st,(Filtration_value *)&local_598);
  uVar2 = local_580[8];
  uVar1 = local_580._0_8_;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x3cd);
  local_598._0_1_ = uVar2;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "success";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_e8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x3ce);
  local_598._0_1_ =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1 !=
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "sh != st.null_simplex()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_118 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  local_498.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_498);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x3d0);
  local_4a0.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4a0);
  local_598 = (char **)CONCAT71(local_598._1_7_,iVar3 == 0);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension(sh) == 0";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_148 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_5a8 = (char *)0x300000003;
  pcStack_5a0 = (char *)CONCAT44(pcStack_5a0._4_4_,3);
  local_590 = 3;
  local_560 = (undefined1  [8])0x0;
  local_598 = &local_5a8;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_580,
             (initializer_list<int> *)&st,(Filtration_value *)&local_598);
  uVar2 = local_580[8];
  uVar1 = local_580._0_8_;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x3d2);
  local_598._0_1_ = uVar2;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "success";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_178 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x3d3);
  local_598._0_1_ =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1 !=
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "sh != st.null_simplex()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1a8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  local_4a8.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4a8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x3d5);
  local_4b0.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4b0);
  local_598 = (char **)CONCAT71(local_598._1_7_,iVar3 == 0);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension(sh) == 0";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1d8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_5a8 = (char *)0x400000004;
  pcStack_5a0 = (char *)0x400000004;
  local_590 = 4;
  local_560 = (undefined1  [8])0x0;
  local_598 = &local_5a8;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_580,
             (initializer_list<int> *)&st,(Filtration_value *)&local_598);
  uVar2 = local_580[8];
  uVar1 = local_580._0_8_;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x3d7);
  local_598._0_1_ = uVar2;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "success";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_208 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x3d8);
  local_598._0_1_ =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1 !=
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "sh != st.null_simplex()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_238 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  local_4b8.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4b8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x3da);
  local_4c0.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4c0);
  local_598._0_1_ = iVar3 == 0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension(sh) == 0";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_268 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"dimension =");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," - num_vertices = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," - num_simplices = ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x3de);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  local_598._0_1_ = iVar3 == 0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension() == 0";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_298 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x3df);
  sVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  local_598 = (char **)CONCAT71(local_598._1_7_,
                                sVar5 == st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size)
  ;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.num_simplices() == st.num_vertices()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2c8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_5a8 = (char *)0x100000002;
  pcStack_5a0 = (char *)0x200000001;
  local_590 = 4;
  local_560 = (undefined1  [8])0x0;
  local_598 = &local_5a8;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_580,
             (initializer_list<int> *)&st,(Filtration_value *)&local_598);
  uVar2 = local_580[8];
  uVar1 = local_580._0_8_;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x3e2);
  local_598._0_1_ = uVar2;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "success";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_2f8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x3e3);
  local_598._0_1_ =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1 !=
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "sh != st.null_simplex()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_328 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"st.dimension(sh)= ");
  local_4c8.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4c8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_340,0x3e5);
  local_4d0.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)uVar1;
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st,&local_4d0);
  local_598._0_1_ = iVar3 == 1;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension(sh) == 1";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_358 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"dimension =");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," - num_vertices = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," - num_simplices = ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x3e9);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  local_598._0_1_ = iVar3 == 1;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension() == 1";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_388 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a0,0x3ea);
  sVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  local_598 = (char **)CONCAT71(local_598._1_7_,
                                sVar5 == st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size
                                         + 1);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.num_simplices() == st.num_vertices() + 1";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3b8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_5a8 = (char *)0x200000001;
  pcStack_5a0 = (char *)0x100000002;
  local_590 = 4;
  local_560 = (undefined1  [8])0x0;
  local_598 = &local_5a8;
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::
  insert_simplex_and_subfaces<std::initializer_list<int>>
            ((Simplex_tree<Gudhi::Simplex_tree_options_default> *)local_580,
             (initializer_list<int> *)&st,(Filtration_value *)&local_598);
  uVar2 = local_580[8];
  uVar1 = local_580._0_8_;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x3ee);
  local_598 = (char **)(CONCAT71(local_598._1_7_,uVar2) ^ 1);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "!success";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3e8 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x3ef);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "sh == st.null_simplex()";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_418 = "";
  local_580._24_8_ = &local_5a8;
  local_598._0_1_ = (__buckets_ptr)uVar1 == (__buckets_ptr)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  poVar4 = std::operator<<((ostream *)&std::clog,"dimension =");
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4," - num_vertices = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," - num_simplices = ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x3f3);
  iVar3 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::dimension(&st);
  local_598._0_1_ = iVar3 == 1;
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.dimension() == 1";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_448 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x3f4);
  sVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::num_simplices(&st);
  local_598 = (char **)CONCAT71(local_598._1_7_,
                                sVar5 == st.root_.members_.m_flat_tree.m_data.m_seq.m_holder.m_size
                                         + 1);
  local_590 = 0;
  sStack_588.pi_ = (sp_counted_base *)0x0;
  local_5a8 = "st.num_simplices() == st.num_vertices() + 1";
  pcStack_5a0 = "";
  local_580[8] = 0;
  local_580._0_8_ = &PTR__lazy_ostream_001c1f38;
  local_580._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_unit_test.cpp"
  ;
  local_478 = "";
  local_580._24_8_ = &local_5a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_588);
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::~Simplex_tree(&st);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(insert_duplicated_vertices, typeST, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "TEST INSERT DUPLICATED VERTICES" << std::endl;
  typeST st;

  typename typeST::Simplex_handle sh;
  bool success = false;
  std::tie(sh, success) = st.insert_simplex_and_subfaces({1});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);
  std::tie(sh, success) = st.insert_simplex_and_subfaces({2, 2});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);
  std::tie(sh, success) = st.insert_simplex_and_subfaces({3, 3, 3});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);
  std::tie(sh, success) = st.insert_simplex_and_subfaces({4, 4, 4, 4});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 0);

  std::clog << "dimension =" << st.dimension() << " - num_vertices = " << st.num_vertices()
            << " - num_simplices = " << st.num_simplices() << std::endl;
  BOOST_CHECK(st.dimension() == 0);
  BOOST_CHECK(st.num_simplices() == st.num_vertices());

  std::tie(sh, success) = st.insert_simplex_and_subfaces({2, 1, 1, 2});
  BOOST_CHECK(success);
  BOOST_CHECK(sh != st.null_simplex());
  std::clog << "st.dimension(sh)= " << st.dimension(sh) << std::endl;
  BOOST_CHECK(st.dimension(sh) == 1);

  std::clog << "dimension =" << st.dimension() << " - num_vertices = " << st.num_vertices()
            << " - num_simplices = " << st.num_simplices() << std::endl;
  BOOST_CHECK(st.dimension() == 1);
  BOOST_CHECK(st.num_simplices() == st.num_vertices() + 1);

  // Already inserted
  std::tie(sh, success) = st.insert_simplex_and_subfaces({1, 2, 2, 1});
  BOOST_CHECK(!success);
  BOOST_CHECK(sh == st.null_simplex());

  std::clog << "dimension =" << st.dimension() << " - num_vertices = " << st.num_vertices()
            << " - num_simplices = " << st.num_simplices() << std::endl;
  BOOST_CHECK(st.dimension() == 1);
  BOOST_CHECK(st.num_simplices() == st.num_vertices() + 1);
}